

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::callFoo(TestMoreStuffImpl *this,CallFooContext context)

{
  CapTableBuilder *pCVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  Disposer *pDVar4;
  RequestHook *pRVar5;
  int iVar6;
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  _func_int **in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *extraout_RDX_02;
  PromiseNode *extraout_RDX_03;
  PromiseNode *extraout_RDX_04;
  PromiseNode *pPVar7;
  int in_R8D;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Promise<void> PVar13;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  Reader params;
  undefined1 local_100 [16];
  CapTableBuilder *pCStack_f0;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_e8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_a8;
  StructReader local_68;
  Maybe<capnp::MessageSize> local_38;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_e8);
  local_a8.super_Builder._builder.data = local_e8.super_Builder._builder.data;
  local_a8.super_Builder._builder.pointers = local_e8.super_Builder._builder.pointers;
  local_a8.super_Builder._builder.segment = local_e8.super_Builder._builder.segment;
  local_a8.super_Builder._builder.capTable = local_e8.super_Builder._builder.capTable;
  PointerReader::getStruct(&local_68,(PointerReader *)&local_a8,(word *)0x0);
  bVar8 = local_68.pointerCount != 0;
  local_a8.super_Builder._builder.data = (WirePointer *)0x0;
  if (bVar8) {
    local_a8.super_Builder._builder.data = local_68.pointers;
  }
  iVar6 = 0x7fffffff;
  if (bVar8) {
    iVar6 = local_68.nestingLimit;
  }
  uVar9 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar12 = 0;
  if (bVar8) {
    uVar9 = local_68.segment._0_4_;
    uVar10 = local_68.segment._4_4_;
    uVar11 = local_68.capTable._0_4_;
    uVar12 = local_68.capTable._4_4_;
  }
  local_a8.super_Builder._builder.segment = (SegmentBuilder *)CONCAT44(uVar10,uVar9);
  local_a8.super_Builder._builder.capTable = (CapTableBuilder *)CONCAT44(uVar12,uVar11);
  local_a8.super_Builder._builder.pointers =
       (WirePointer *)CONCAT44(local_a8.super_Builder._builder.pointers._4_4_,iVar6);
  PointerReader::getCapability((PointerReader *)&local_e8);
  local_100._8_8_ = local_e8.super_Builder._builder.segment;
  pCStack_f0 = local_e8.super_Builder._builder.capTable;
  local_100._0_8_ = &Capability::Client::typeinfo;
  local_38.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_a8,(Client *)local_100,&local_38);
  ((WireValue<uint32_t>_conflict *)local_a8.super_Builder._builder.data)->value = 0x7b;
  *(byte *)((long)local_a8.super_Builder._builder.data + 4) =
       *(byte *)((long)local_a8.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_e8,(int)&local_a8,__buf,in_RCX,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_e8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1031:7),_kj::_::PropagateException>
             ::anon_class_8_1_bc11688f_for_func::operator());
  pDVar4 = local_e8.hook.disposer;
  uVar3 = local_e8.super_Builder._builder._32_8_;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00612068;
  this_00[1].super_PromiseNode._vptr_PromiseNode = in_RDX;
  *(undefined8 **)&this->super_Server =
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>,capnp::_::TestMoreStuffImpl::callFoo(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,capnproto_test::capnp::test::TestMoreStuff::CallFooResults>)::$_0,kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  pPVar7 = extraout_RDX;
  if (local_e8.super_Builder._builder._32_8_ != 0) {
    local_e8.super_Builder._builder.dataSize = 0;
    local_e8.super_Builder._builder.pointerCount = 0;
    local_e8.super_Builder._builder._38_2_ = 0;
    local_e8.hook.disposer = (Disposer *)0x0;
    (**(local_e8.hook.ptr)->_vptr_RequestHook)(local_e8.hook.ptr,uVar3,8,pDVar4,pDVar4,0);
    pPVar7 = extraout_RDX_00;
  }
  pWVar2 = local_e8.super_Builder._builder.pointers;
  if (local_e8.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_e8.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_e8.super_Builder._builder.data)
              (local_e8.super_Builder._builder.data,
               (long)&(pWVar2->offsetAndKind).value + *(long *)((long)*pWVar2 + -0x10));
    pPVar7 = extraout_RDX_01;
  }
  pCVar1 = local_e8.super_Builder._builder.capTable;
  if (local_e8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_e8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_e8.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_e8.super_Builder._builder.segment,
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar1->super_CapTableReader);
    pPVar7 = extraout_RDX_02;
  }
  pRVar5 = local_a8.hook.ptr;
  if (local_a8.hook.ptr != (RequestHook *)0x0) {
    local_a8.hook.ptr = (RequestHook *)0x0;
    (**(local_a8.hook.disposer)->_vptr_Disposer)
              (local_a8.hook.disposer,
               pRVar5->_vptr_RequestHook[-2] + (long)&pRVar5->_vptr_RequestHook);
    pPVar7 = extraout_RDX_03;
  }
  pCVar1 = pCStack_f0;
  if (pCStack_f0 != (CapTableBuilder *)0x0) {
    pCStack_f0 = (CapTableBuilder *)0x0;
    (*(code *)((SegmentReader *)local_100._8_8_)->arena->_vptr_Arena)
              (local_100._8_8_,
               (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&pCVar1->super_CapTableReader);
    pPVar7 = extraout_RDX_04;
  }
  PVar13.super_PromiseBase.node.ptr = pPVar7;
  PVar13.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar13.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::callFoo(CallFooContext context) {
  ++callCount;

  auto params = context.getParams();
  auto cap = params.getCap();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);

  return request.send().then(
      [KJ_CPCAP(context)](Response<test::TestInterface::FooResults>&& response) mutable {
        EXPECT_EQ("foo", response.getX());
        context.getResults().setS("bar");
      }